

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_result
drwav__read_chunk_header
          (drwav_read_proc onRead,void *pUserData,drwav_container container,
          drwav_uint64 *pRunningBytesReadOut,drwav_chunk_header *pHeaderOut)

{
  size_t sVar1;
  drwav_uint8 sizeInBytes [4];
  drwav_uint8 sizeInBytes_1 [8];
  
  if (drwav_container_aiff < container) {
    return -10;
  }
  if (container == drwav_container_w64) {
    sVar1 = (*onRead)(pUserData,pHeaderOut,0x10);
    if (sVar1 != 0x10) {
      return -0x35;
    }
    sVar1 = (*onRead)(pUserData,sizeInBytes_1,8);
    if (sVar1 == 8) {
      pHeaderOut->sizeInBytes = (long)sizeInBytes_1 - 0x18;
      pHeaderOut->paddingSize = sizeInBytes_1._0_4_ & 7;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 0x18;
      return 0;
    }
  }
  else {
    sVar1 = (*onRead)(pUserData,pHeaderOut,4);
    if (sVar1 != 4) {
      return -0x35;
    }
    sVar1 = (*onRead)(pUserData,sizeInBytes,4);
    if (sVar1 == 4) {
      if ((container == drwav_container_aiff) || (container == drwav_container_rifx)) {
        sizeInBytes = (drwav_uint8  [4])
                      ((uint)sizeInBytes >> 0x18 | ((uint)sizeInBytes & 0xff0000) >> 8 |
                       ((uint)sizeInBytes & 0xff00) << 8 | (int)sizeInBytes << 0x18);
      }
      pHeaderOut->sizeInBytes = (ulong)(uint)sizeInBytes;
      pHeaderOut->paddingSize = (uint)sizeInBytes & 1;
      *pRunningBytesReadOut = *pRunningBytesReadOut + 8;
      return 0;
    }
  }
  return -10;
}

Assistant:

DRWAV_PRIVATE drwav_result drwav__read_chunk_header(drwav_read_proc onRead, void* pUserData, drwav_container container, drwav_uint64* pRunningBytesReadOut, drwav_chunk_header* pHeaderOut)
{
    if (container == drwav_container_riff || container == drwav_container_rifx || container == drwav_container_rf64 || container == drwav_container_aiff) {
        drwav_uint8 sizeInBytes[4];

        if (onRead(pUserData, pHeaderOut->id.fourcc, 4) != 4) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 4) != 4) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav_bytes_to_u32_ex(sizeInBytes, container);
        pHeaderOut->paddingSize = drwav__chunk_padding_size_riff(pHeaderOut->sizeInBytes);

        *pRunningBytesReadOut += 8;
    } else if (container == drwav_container_w64) {
        drwav_uint8 sizeInBytes[8];

        if (onRead(pUserData, pHeaderOut->id.guid, 16) != 16) {
            return DRWAV_AT_END;
        }

        if (onRead(pUserData, sizeInBytes, 8) != 8) {
            return DRWAV_INVALID_FILE;
        }

        pHeaderOut->sizeInBytes = drwav_bytes_to_u64(sizeInBytes) - 24;    /* <-- Subtract 24 because w64 includes the size of the header. */
        pHeaderOut->paddingSize = drwav__chunk_padding_size_w64(pHeaderOut->sizeInBytes);
        *pRunningBytesReadOut += 24;
    } else {
        return DRWAV_INVALID_FILE;
    }

    return DRWAV_SUCCESS;
}